

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::UpdateTextureRegion
          (DeviceContextVkImpl *this,void *pSrcData,Uint64 SrcStride,Uint64 SrcDepthStride,
          TextureVkImpl *TextureVk,Uint32 MipLevel,Uint32 Slice,Box *DstBox,
          RESOURCE_STATE_TRANSITION_MODE TextureTransitionMode)

{
  Char *pCVar1;
  RenderDeviceVkImpl *this_00;
  VulkanPhysicalDevice *this_01;
  VkPhysicalDeviceProperties *pVVar2;
  unsigned_long *puVar3;
  TextureFormatAttribs *pTVar4;
  long lVar5;
  VkBuffer __dest;
  unsigned_long __n;
  long lVar6;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  Uint8 *pDstPtr;
  Uint8 *pSrcPtr;
  Uint32 row;
  Uint32 DepthSlice;
  string msg_3;
  Uint64 PlaneSize;
  string msg_2;
  string msg_1;
  VulkanUploadAllocation Allocation;
  TextureFormatAttribs *FmtAttribs;
  unsigned_long local_c8;
  VkDeviceSize BufferOffsetAlignment;
  undefined1 auStack_b8 [4];
  Uint32 UpdateRegionDepth;
  BufferToTextureCopyInfo CopyInfo;
  VkPhysicalDeviceLimits *DeviceLimits;
  undefined1 local_60 [8];
  string msg;
  TextureDesc *TexDesc;
  Uint32 MipLevel_local;
  TextureVkImpl *TextureVk_local;
  Uint64 SrcDepthStride_local;
  Uint64 SrcStride_local;
  void *pSrcData_local;
  DeviceContextVkImpl *this_local;
  
  TextureVk_local = (TextureVkImpl *)SrcDepthStride;
  SrcDepthStride_local = SrcStride;
  SrcStride_local = (Uint64)pSrcData;
  pSrcData_local = this;
  msg.field_2._8_8_ =
       DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>::
       GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                *)TextureVk);
  if (((TextureDesc *)msg.field_2._8_8_)->SampleCount != 1) {
    FormatString<char[73]>
              ((string *)local_60,
               (char (*) [73])
               "Only single-sample textures can be updated with vkCmdCopyBufferToImage()");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"UpdateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9c3);
    std::__cxx11::string::~string((string *)local_60);
  }
  this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                      (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  this_01 = RenderDeviceVkImpl::GetPhysicalDevice(this_00);
  pVVar2 = VulkanUtilities::VulkanPhysicalDevice::GetProperties(this_01);
  CopyInfo.Region._16_8_ = &pVVar2->limits;
  GetBufferToTextureCopyInfo
            ((BufferToTextureCopyInfo *)auStack_b8,*(TEXTURE_FORMAT *)(msg.field_2._8_8_ + 0x18),
             DstBox,(Uint32)(pVVar2->limits).optimalBufferCopyRowPitchAlignment);
  BufferOffsetAlignment._4_4_ = Box::Depth((Box *)&CopyInfo.MemorySize);
  FmtAttribs = (TextureFormatAttribs *)0x4;
  puVar3 = std::max<unsigned_long>
                     ((unsigned_long *)(CopyInfo.Region._16_8_ + 0x1e0),(unsigned_long *)&FmtAttribs
                     );
  local_c8 = *puVar3;
  pTVar4 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(msg.field_2._8_8_ + 0x18));
  if (pTVar4->ComponentType == COMPONENT_TYPE_COMPRESSED) {
    Allocation.AlignedOffset = (VkDeviceSize)pTVar4->ComponentSize;
    puVar3 = std::max<unsigned_long>(&local_c8,&Allocation.AlignedOffset);
    local_c8 = *puVar3;
  }
  VulkanUploadHeap::Allocate
            ((VulkanUploadAllocation *)((long)&msg_1.field_2 + 8),&this->m_UploadHeap,
             CopyInfo.DepthStride,local_c8);
  if (Allocation.Size % local_c8 != 0) {
    FormatString<char[50]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [50])"Allocation offset must be at least 32-bit aligned");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"UpdateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9d6);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (SrcDepthStride_local < _auStack_b8) {
    FormatString<char[21],unsigned_long,char[32],unsigned_long,char[2]>
              ((string *)&PlaneSize,(Diligent *)"Source data stride (",
               (char (*) [21])&SrcDepthStride_local,
               (unsigned_long *)") is below the image row size (",(char (*) [32])auStack_b8,
               (unsigned_long *)0xf65f2d,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"UpdateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9da);
    std::__cxx11::string::~string((string *)&PlaneSize);
  }
  msg_3.field_2._8_8_ = SrcDepthStride_local * CopyInfo.RowStride._4_4_;
  if ((BufferOffsetAlignment._4_4_ != 1) && (TextureVk_local < (ulong)msg_3.field_2._8_8_)) {
    FormatString<char[27],unsigned_long,char[34],unsigned_long,char[2]>
              ((string *)&row,(Diligent *)"Source data depth stride (",
               (char (*) [27])&TextureVk_local,(unsigned_long *)") is below the image plane size (",
               (char (*) [34])((long)&msg_3.field_2 + 8),(unsigned_long *)0xf65f2d,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"UpdateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9dc);
    std::__cxx11::string::~string((string *)&row);
  }
  for (pSrcPtr._4_4_ = 0; pSrcPtr._4_4_ < BufferOffsetAlignment._4_4_;
      pSrcPtr._4_4_ = pSrcPtr._4_4_ + 1) {
    for (pSrcPtr._0_4_ = 0; (uint)pSrcPtr < CopyInfo.RowStride._4_4_;
        pSrcPtr._0_4_ = (uint)pSrcPtr + 1) {
      lVar5 = SrcStride_local + (uint)pSrcPtr * SrcDepthStride_local;
      lVar6 = (ulong)pSrcPtr._4_4_ * (long)TextureVk_local;
      __dest = Allocation.vkBuffer +
               (ulong)pSrcPtr._4_4_ * CopyInfo._16_8_ + (uint)pSrcPtr * CopyInfo.RowSize;
      __n = StaticCast<unsigned_long,unsigned_long>((unsigned_long *)auStack_b8);
      memcpy(__dest,(void *)(lVar5 + lVar6),__n);
    }
  }
  CopyBufferToTexture(this,(VkBuffer)msg_1.field_2._8_8_,Allocation.Size,(Uint32)CopyInfo.RowStride,
                      TextureVk,(Box *)&CopyInfo.MemorySize,MipLevel,Slice,TextureTransitionMode);
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateTextureRegion(const void*                    pSrcData,
                                              Uint64                         SrcStride,
                                              Uint64                         SrcDepthStride,
                                              TextureVkImpl&                 TextureVk,
                                              Uint32                         MipLevel,
                                              Uint32                         Slice,
                                              const Box&                     DstBox,
                                              RESOURCE_STATE_TRANSITION_MODE TextureTransitionMode)
{
    const TextureDesc& TexDesc = TextureVk.GetDesc();
    VERIFY(TexDesc.SampleCount == 1, "Only single-sample textures can be updated with vkCmdCopyBufferToImage()");

    const VkPhysicalDeviceLimits& DeviceLimits      = m_pDevice->GetPhysicalDevice().GetProperties().limits;
    const BufferToTextureCopyInfo CopyInfo          = GetBufferToTextureCopyInfo(TexDesc.Format, DstBox, static_cast<Uint32>(DeviceLimits.optimalBufferCopyRowPitchAlignment));
    const Uint32                  UpdateRegionDepth = CopyInfo.Region.Depth();

    // For UpdateTextureRegion(), use UploadHeap, not dynamic heap
    // Source buffer offset must be multiple of 4 (18.4)
    VkDeviceSize BufferOffsetAlignment = std::max(DeviceLimits.optimalBufferCopyOffsetAlignment, VkDeviceSize{4});
    // If the calling command's VkImage parameter is a compressed image, bufferOffset must be a multiple of
    // the compressed texel block size in bytes (18.4)
    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);
    if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
    {
        BufferOffsetAlignment = std::max(BufferOffsetAlignment, VkDeviceSize{FmtAttribs.ComponentSize});
    }
    VulkanUploadAllocation Allocation = m_UploadHeap.Allocate(CopyInfo.MemorySize, BufferOffsetAlignment);
    // The allocation will stay in the upload heap until the end of the frame at which point all upload
    // pages will be discarded
    VERIFY((Allocation.AlignedOffset % BufferOffsetAlignment) == 0, "Allocation offset must be at least 32-bit aligned");

#ifdef DILIGENT_DEBUG
    {
        VERIFY(SrcStride >= CopyInfo.RowSize, "Source data stride (", SrcStride, ") is below the image row size (", CopyInfo.RowSize, ")");
        const Uint64 PlaneSize = SrcStride * CopyInfo.RowCount;
        VERIFY(UpdateRegionDepth == 1 || SrcDepthStride >= PlaneSize, "Source data depth stride (", SrcDepthStride, ") is below the image plane size (", PlaneSize, ")");
    }
#endif
    for (Uint32 DepthSlice = 0; DepthSlice < UpdateRegionDepth; ++DepthSlice)
    {
        for (Uint32 row = 0; row < CopyInfo.RowCount; ++row)
        {
            // clang-format off
            const Uint8* pSrcPtr =
                reinterpret_cast<const Uint8*>(pSrcData)
                + row        * SrcStride
                + DepthSlice * SrcDepthStride;
            Uint8* pDstPtr =
                reinterpret_cast<Uint8*>(Allocation.CPUAddress)
                + row        * CopyInfo.RowStride
                + DepthSlice * CopyInfo.DepthStride;
            // clang-format on

            memcpy(pDstPtr, pSrcPtr, StaticCast<size_t>(CopyInfo.RowSize));
        }
    }
    CopyBufferToTexture(Allocation.vkBuffer,
                        Allocation.AlignedOffset,
                        CopyInfo.RowStrideInTexels,
                        TextureVk,
                        CopyInfo.Region,
                        MipLevel,
                        Slice,
                        TextureTransitionMode);
}